

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

elem * __thiscall
cilkred_map::insert_no_rehash
          (cilkred_map *this,__cilkrts_worker *w,void *key,__cilkrts_hyperobject_base *hb,void *view
          )

{
  elem *peVar1;
  __cilkrts_hyperobject_base *in_RCX;
  void *in_RDX;
  long in_RSI;
  cilkred_map *in_RDI;
  __cilkrts_worker *in_R8;
  bool bVar2;
  elem *el;
  bucket **in_stack_ffffffffffffffd0;
  
  if ((in_RSI != 0) || (bVar2 = true, in_RDI->g != (global_state_t *)0x0)) {
    bVar2 = *(global_state_t **)(in_RSI + 0x30) == in_RDI->g;
  }
  if (!bVar2) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                  ,0x1bd,"(w == 0 && g == 0) || w->g == g");
  }
  if (in_RDX == (void *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                  ,0x1be,"key != 0");
  }
  if (in_R8 != (__cilkrts_worker *)0x0) {
    hashfun(in_RDI,in_RDX);
    peVar1 = grow(in_R8,in_stack_ffffffffffffffd0);
    peVar1->key = in_RDX;
    peVar1->hb = in_RCX;
    peVar1->view = in_R8;
    in_RDI->nelem = in_RDI->nelem + 1;
    return peVar1;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                ,0x1bf,"view != 0");
}

Assistant:

elem *cilkred_map::insert_no_rehash(__cilkrts_worker           *w,
				    void                       *key,
				    __cilkrts_hyperobject_base *hb,
                                    void                       *view)
{

#if REDPAR_DEBUG >= 2
    fprintf(stderr, "[W=%d, desc=insert_no_rehash, this_map=%p]\n",
	    w->self, this);
    verify_current_wkr(w);
#endif
    
    CILK_ASSERT((w == 0 && g == 0) || w->g == g);
    CILK_ASSERT(key != 0);
    CILK_ASSERT(view != 0);
	    
    elem *el = grow(w, &(buckets[hashfun(this, key)]));

#if REDPAR_DEBUG >= 3
    fprintf(stderr, "[W=%d, this=%p, inserting key=%p, view=%p, el = %p]\n",
	    w->self, this, key, view, el);
#endif

    el->key = key;
    el->hb  = hb;
    el->view = view;
    ++nelem;

    return el;
}